

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O1

void __thiscall brown::Tile::drawcircfill(Tile *this,int xc,int yc,int r,uint32_t col)

{
  int iVar1;
  uintptr_t uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  double dVar8;
  
  uVar6 = yc - r;
  if ((int)uVar6 <= r + yc) {
    do {
      dVar8 = (double)(int)(((yc - uVar6) + r) * (r - (yc - uVar6)));
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if (uVar6 < (uint)this->y) {
        uVar4 = xc - (int)dVar8;
        uVar3 = (int)dVar8 + xc;
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        if (this->x < (int)uVar3) {
          uVar3 = this->x;
        }
        if ((int)uVar4 < (int)uVar3) {
          iVar1 = this->p;
          uVar2 = this->f;
          uVar5 = (ulong)uVar4;
          do {
            *(uint32_t *)((long)(int)uVar6 * (long)iVar1 + uVar2 + uVar5 * 4) = col;
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
      }
      bVar7 = uVar6 != r + yc;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  return;
}

Assistant:

void Tile::drawcircfill (int xc, int yc, int r, std::uint32_t col)
{
    int i, y;
    for(y=yc-r;y<=yc+r;y++)
    {
        i = (int)sqrt((double)(r*r - (yc-y)*(yc-y)));
        this->drawhlin(xc-i,xc+i,y,col);
    }
}